

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
basic_bson_parser<std::istream&>
          (basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          basic_istream<char,_std::char_traits<char>_> *source,bson_decode_options *options,
          allocator<char> *temp_alloc)

{
  _func_int *p_Var1;
  int local_3c [3];
  
  *(undefined ***)this = &PTR__basic_bson_parser_00b5a198;
  *(undefined2 *)(this + 8) = 1;
  this[10] = (basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
  *(undefined4 *)(this + 0xc) = 0;
  stream_source<unsigned_char>::stream_source
            ((stream_source<unsigned_char> *)(this + 0x10),source,0x4000);
  p_Var1 = options->_vptr_bson_decode_options[-3];
  *(undefined ***)(this + 0x1b0) = &PTR__bson_options_common_00b593e0;
  *(undefined4 *)(this + 0x1b8) = *(undefined4 *)(&options->field_0x8 + (long)p_Var1);
  *(undefined8 *)(this + 0x1a8) = 0xb596c0;
  *(undefined8 *)(this + 0x1b0) = 0xb596e8;
  *(undefined8 *)(this + 0x1c0) = 0;
  *(undefined8 *)(this + 0x1c8) = 0;
  *(undefined8 *)(this + 0x1d0) = 0;
  *(basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> **)(this + 0x1d8)
       = this + 0x1e8;
  *(undefined8 *)(this + 0x1e0) = 0;
  this[0x1e8] = (basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
  *(basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> **)(this + 0x1f8)
       = this + 0x208;
  *(undefined8 *)(this + 0x200) = 0;
  this[0x208] = (basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
  *(undefined8 *)(this + 0x218) = 0;
  *(undefined8 *)(this + 0x220) = 0;
  *(undefined8 *)(this + 0x228) = 0;
  local_3c[2] = 0;
  local_3c[1] = 0;
  local_3c[0] = 0;
  std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
  emplace_back<jsoncons::bson::parse_mode,int,int>
            ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
             (this + 0x218),(parse_mode *)(local_3c + 2),local_3c + 1,local_3c);
  return;
}

Assistant:

basic_bson_parser(Sourceable&& source,
                      const bson_decode_options& options = bson_decode_options(),
                      const TempAllocator& temp_alloc = TempAllocator())
       : source_(std::forward<Sourceable>(source)), 
         options_(options),
         bytes_buffer_(temp_alloc),
         name_buffer_(temp_alloc),
         text_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0,0);
    }